

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapUICommand.cxx
# Opt level: O1

bool cmQTWrapUICommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  pointer pcVar3;
  long *plVar4;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var5;
  undefined8 uVar6;
  ulong uVar7;
  pointer pbVar8;
  bool bVar9;
  string *psVar10;
  string *psVar11;
  cmSourceFile *this;
  string *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  string_view value;
  string_view value_00;
  __single_object cc;
  string sourceListValue;
  string headerListValue;
  string uiName;
  string hName;
  string mocName;
  string cxxName;
  string srcName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines mocCommandLines;
  cmCustomCommandLines cxxCommandLines;
  cmCustomCommandLines hCommandLines;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_348;
  cmMakefile *local_340;
  _Any_data local_338;
  code *local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  pointer local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  size_type local_2f8;
  pointer local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  long *local_2d8;
  size_t local_2d0;
  long local_2c8 [2];
  long *local_2b8;
  size_t local_2b0;
  long local_2a8 [2];
  value_type local_298;
  string local_278;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_258;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_250;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_248;
  string local_240;
  string local_210;
  string local_1f0;
  ulong local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string *local_128;
  string *local_120;
  string *local_118;
  string *local_110;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_108;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_f0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_d8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_1d0 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  if (local_1d0 < 0x61) {
    local_338._M_unused._M_object = &local_328;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    uVar7 = local_1d0;
    local_1d0 = uVar7;
    if ((code **)local_338._M_unused._0_8_ != &local_328) {
      operator_delete(local_338._M_unused._M_object,(ulong)(local_328 + 1));
      local_1d0 = uVar7;
    }
  }
  else {
    pcVar1 = status->Makefile;
    local_338._M_unused._M_object = &local_328;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"QT_UIC_EXECUTABLE","");
    psVar10 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)&local_338);
    if ((code **)local_338._M_unused._0_8_ != &local_328) {
      operator_delete(local_338._M_unused._M_object,(ulong)(local_328 + 1));
    }
    local_338._M_unused._M_object = &local_328;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"QT_MOC_EXECUTABLE","");
    local_118 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)&local_338);
    if ((code **)local_338._M_unused._0_8_ != &local_328) {
      operator_delete(local_338._M_unused._M_object,(ulong)(local_328 + 1));
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_128 = pbVar2 + 1;
    psVar12 = pbVar2 + 2;
    psVar11 = cmMakefile::GetSafeDefinition(pcVar1,local_128);
    local_2b8 = local_2a8;
    pcVar3 = (psVar11->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,pcVar3,pcVar3 + psVar11->_M_string_length);
    local_340 = pcVar1;
    local_120 = psVar12;
    psVar11 = cmMakefile::GetSafeDefinition(pcVar1,psVar12);
    local_2d8 = local_2c8;
    pcVar3 = (psVar11->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d8,pcVar3,pcVar3 + psVar11->_M_string_length);
    local_110 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    psVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 3;
    if (psVar11 != local_110) {
      do {
        this = cmMakefile::GetSource(local_340,psVar11,Ambiguous);
        if (this == (cmSourceFile *)0x0) {
          bVar9 = false;
        }
        else {
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"WRAP_EXCLUDE","");
          bVar9 = cmSourceFile::GetPropertyAsBool(this,&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar9 == false) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1f0,psVar11);
          psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_340);
          local_338._8_8_ = (psVar12->_M_dataplus)._M_p;
          local_338._M_unused._0_8_ = (undefined8)psVar12->_M_string_length;
          local_240._M_dataplus._M_p = &DAT_00000001;
          paStack_320 = &local_240.field_2;
          local_240.field_2._M_local_buf[0] = '/';
          local_328 = (code *)0x1;
          local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_string_length;
          local_310 = local_1f0._M_dataplus._M_p;
          local_308 = 2;
          local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x7d6e00;
          views._M_len = 4;
          views._M_array = (iterator)&local_338;
          local_240._M_string_length = (size_type)paStack_320;
          cmCatViews_abi_cxx11_(&local_278,views);
          psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_340);
          local_338._8_8_ = (psVar12->_M_dataplus)._M_p;
          local_338._M_unused._0_8_ = (undefined8)psVar12->_M_string_length;
          local_240._M_dataplus._M_p = &DAT_00000001;
          paStack_320 = &local_240.field_2;
          local_240.field_2._M_local_buf[0] = '/';
          local_328 = (code *)0x1;
          local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_string_length;
          local_310 = local_1f0._M_dataplus._M_p;
          local_308 = 4;
          local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x7df02d;
          views_00._M_len = 4;
          views_00._M_array = (iterator)&local_338;
          local_240._M_string_length = (size_type)paStack_320;
          cmCatViews_abi_cxx11_(&local_210,views_00);
          psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_340);
          local_338._8_8_ = (psVar12->_M_dataplus)._M_p;
          local_338._M_unused._0_8_ = (undefined8)psVar12->_M_string_length;
          local_328 = (code *)0x5;
          paStack_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x7bb075;
          local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_string_length;
          local_310 = local_1f0._M_dataplus._M_p;
          local_308 = 4;
          local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x7df02d;
          views_01._M_len = 4;
          views_01._M_array = (iterator)&local_338;
          cmCatViews_abi_cxx11_(&local_240,views_01);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          local_298._M_string_length = 0;
          local_298.field_2._M_local_buf[0] = '\0';
          bVar9 = cmsys::SystemTools::FileIsFullPath(psVar11);
          if (bVar9) {
            std::__cxx11::string::_M_assign((string *)&local_298);
          }
          else {
            if ((this == (cmSourceFile *)0x0) ||
               (bVar9 = cmSourceFile::GetIsGenerated(this,GlobalAndLocal), !bVar9)) {
              cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_340);
            }
            else {
              cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_340);
            }
            std::__cxx11::string::_M_assign((string *)&local_298);
            std::__cxx11::string::append((char *)&local_298);
            std::__cxx11::string::_M_append((char *)&local_298,(ulong)(psVar11->_M_dataplus)._M_p);
          }
          if (local_2b0 != 0) {
            std::__cxx11::string::append((char *)&local_2b8);
          }
          std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_278._M_dataplus._M_p);
          if (local_2d0 != 0) {
            std::__cxx11::string::append((char *)&local_2d8);
          }
          std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_210._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_2d8);
          std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_240._M_dataplus._M_p);
          local_338._8_8_ = (psVar10->_M_dataplus)._M_p;
          local_338._M_unused._0_8_ = (undefined8)psVar10->_M_string_length;
          local_328 = (code *)0x2;
          paStack_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x7af436;
          local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_string_length;
          local_310 = local_278._M_dataplus._M_p;
          local_308 = local_298._M_string_length;
          local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_298._M_dataplus._M_p;
          ilist._M_len = 4;
          ilist._M_array = (iterator)&local_338;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_d8,ilist);
          local_338._8_8_ = (psVar10->_M_dataplus)._M_p;
          local_338._M_unused._0_8_ = (undefined8)psVar10->_M_string_length;
          local_328 = (code *)0x5;
          paStack_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x7bb09d;
          local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_string_length;
          local_310 = local_278._M_dataplus._M_p;
          local_308 = 2;
          local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x7af436;
          local_2f8 = local_210._M_string_length;
          local_2f0 = local_210._M_dataplus._M_p;
          local_2e8 = local_298._M_string_length;
          local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_298._M_dataplus._M_p;
          ilist_00._M_len = 6;
          ilist_00._M_array = (iterator)&local_338;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_f0,ilist_00);
          local_338._8_8_ = (local_118->_M_dataplus)._M_p;
          local_338._M_unused._0_8_ = (undefined8)local_118->_M_string_length;
          local_328 = (code *)0x2;
          paStack_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x7af436;
          local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_240._M_string_length;
          local_310 = local_240._M_dataplus._M_p;
          local_308 = local_278._M_string_length;
          local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_dataplus._M_p;
          ilist_01._M_len = 4;
          ilist_01._M_array = (iterator)&local_338;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_108,ilist_01);
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1c8,&local_298);
          std::make_unique<cmCustomCommand>();
          _Var5._M_head_impl = local_348._M_head_impl;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_278._M_dataplus._M_p,
                     local_278._M_dataplus._M_p + local_278._M_string_length);
          cmCustomCommand::SetOutputs(_Var5._M_head_impl,&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          _Var5._M_head_impl = local_348._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_1c8);
          cmCustomCommand::SetDepends(_Var5._M_head_impl,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var5._M_head_impl = local_348._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_60,&local_d8);
          cmCustomCommand::SetCommandLines(_Var5._M_head_impl,(cmCustomCommandLines *)&local_60);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_60)
          ;
          local_248._M_head_impl = local_348._M_head_impl;
          local_348._M_head_impl = (cmCustomCommand *)0x0;
          local_328 = (code *)0x0;
          paStack_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          local_338._M_unused._M_object = (cmCustomCommand *)0x0;
          local_338._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (local_340,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_248,(CommandSourceCallback *)&local_338,false);
          if (local_328 != (code *)0x0) {
            (*local_328)(&local_338,&local_338,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_248);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1c8,&local_278);
          std::make_unique<cmCustomCommand>();
          uVar6 = local_338._M_unused._0_8_;
          _Var5._M_head_impl = local_348._M_head_impl;
          local_338._M_unused._M_object = (void *)0x0;
          local_348._M_head_impl = (cmCustomCommand *)uVar6;
          if (_Var5._M_head_impl != (cmCustomCommand *)0x0) {
            cmCustomCommand::~cmCustomCommand(_Var5._M_head_impl);
            operator_delete(_Var5._M_head_impl,0x138);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_338);
          _Var5._M_head_impl = local_348._M_head_impl;
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_188,local_210._M_dataplus._M_p,
                     local_210._M_dataplus._M_p + local_210._M_string_length);
          cmCustomCommand::SetOutputs(_Var5._M_head_impl,&local_188);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          _Var5._M_head_impl = local_348._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_78,&local_1c8);
          cmCustomCommand::SetDepends(_Var5._M_head_impl,&local_78);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
          _Var5._M_head_impl = local_348._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_90,&local_f0);
          cmCustomCommand::SetCommandLines(_Var5._M_head_impl,(cmCustomCommandLines *)&local_90);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_90)
          ;
          local_250._M_head_impl = local_348._M_head_impl;
          local_348._M_head_impl = (cmCustomCommand *)0x0;
          local_328 = (code *)0x0;
          paStack_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          local_338._M_unused._M_object = (cmCustomCommand *)0x0;
          local_338._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (local_340,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_250,(CommandSourceCallback *)&local_338,false);
          if (local_328 != (code *)0x0) {
            (*local_328)(&local_338,&local_338,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_250);
          pbVar8 = local_1c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar2 = local_1c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar13 = &(local_1c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar13 + -1))->_M_dataplus)._M_p;
              if (paVar13 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar4) {
                operator_delete(plVar4,paVar13->_M_allocated_capacity + 1);
              }
              pbVar14 = (pointer)(paVar13 + 1);
              paVar13 = paVar13 + 2;
            } while (pbVar14 != pbVar8);
            local_1c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1c8,&local_278);
          std::make_unique<cmCustomCommand>();
          uVar6 = local_338._M_unused._0_8_;
          _Var5._M_head_impl = local_348._M_head_impl;
          local_338._M_unused._M_object = (void *)0x0;
          local_348._M_head_impl = (cmCustomCommand *)uVar6;
          if (_Var5._M_head_impl != (cmCustomCommand *)0x0) {
            cmCustomCommand::~cmCustomCommand(_Var5._M_head_impl);
            operator_delete(_Var5._M_head_impl,0x138);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_338);
          _Var5._M_head_impl = local_348._M_head_impl;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_240._M_dataplus._M_p,
                     (char *)(local_240._M_string_length + (long)local_240._M_dataplus._M_p));
          cmCustomCommand::SetOutputs(_Var5._M_head_impl,&local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          _Var5._M_head_impl = local_348._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_a8,&local_1c8);
          cmCustomCommand::SetDepends(_Var5._M_head_impl,&local_a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
          _Var5._M_head_impl = local_348._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_c0,&local_108);
          cmCustomCommand::SetCommandLines(_Var5._M_head_impl,(cmCustomCommandLines *)&local_c0);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_c0)
          ;
          local_258._M_head_impl = local_348._M_head_impl;
          local_348._M_head_impl = (cmCustomCommand *)0x0;
          local_328 = (code *)0x0;
          paStack_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          local_338._M_unused._M_object = (code **)0x0;
          local_338._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (local_340,
                     (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_258,(CommandSourceCallback *)&local_338,false);
          if (local_328 != (code *)0x0) {
            (*local_328)(&local_338,&local_338,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_258);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_348);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1c8);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                    (&local_108);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_f0)
          ;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_d8)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,
                            CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                     local_298.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,
                            CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                     local_240.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
        }
        psVar11 = psVar11 + 1;
      } while (psVar11 != local_110);
    }
    pcVar1 = local_340;
    value._M_str = (char *)local_2d8;
    value._M_len = local_2d0;
    cmMakefile::AddDefinition(local_340,local_120,value);
    value_00._M_str = (char *)local_2b8;
    value_00._M_len = local_2b0;
    cmMakefile::AddDefinition(pcVar1,local_128,value_00);
    if (local_2d8 != local_2c8) {
      operator_delete(local_2d8,local_2c8[0] + 1);
    }
    if (local_2b8 != local_2a8) {
      operator_delete(local_2b8,local_2a8[0] + 1);
    }
  }
  return 0x60 < local_1d0;
}

Assistant:

bool cmQTWrapUICommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the uic and moc executables to run in the custom commands.
  std::string const& uic_exe = mf.GetRequiredDefinition("QT_UIC_EXECUTABLE");
  std::string const& moc_exe = mf.GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& headerList = args[1];
  std::string const& sourceList = args[2];
  std::string headerListValue = mf.GetSafeDefinition(headerList);
  std::string sourceListValue = mf.GetSafeDefinition(sourceList);

  // Create rules for all sources listed.
  for (std::string const& arg : cmMakeRange(args).advance(3)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the files to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(arg);
      std::string hName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), '/', srcName, ".h");
      std::string cxxName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), '/', srcName, ".cxx");
      std::string mocName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), "/moc_", srcName, ".cxx");

      // Compute the name of the ui file from which to generate others.
      std::string uiName;
      if (cmSystemTools::FileIsFullPath(arg)) {
        uiName = arg;
      } else {
        if (curr && curr->GetIsGenerated()) {
          uiName = mf.GetCurrentBinaryDirectory();
        } else {
          uiName = mf.GetCurrentSourceDirectory();
        }
        uiName += "/";
        uiName += arg;
      }

      // create the list of headers
      if (!headerListValue.empty()) {
        headerListValue += ";";
      }
      headerListValue += hName;

      // create the list of sources
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += cxxName;
      sourceListValue += ";";
      sourceListValue += mocName;

      // set up .ui to .h and .cxx command
      cmCustomCommandLines hCommandLines =
        cmMakeSingleCommandLine({ uic_exe, "-o", hName, uiName });
      cmCustomCommandLines cxxCommandLines = cmMakeSingleCommandLine(
        { uic_exe, "-impl", hName, "-o", cxxName, uiName });
      cmCustomCommandLines mocCommandLines =
        cmMakeSingleCommandLine({ moc_exe, "-o", mocName, hName });

      std::vector<std::string> depends;
      depends.push_back(uiName);
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(hName);
      cc->SetDepends(depends);
      cc->SetCommandLines(hCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));

      depends.push_back(hName);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(cxxName);
      cc->SetDepends(depends);
      cc->SetCommandLines(cxxCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));

      depends.clear();
      depends.push_back(hName);
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(mocName);
      cc->SetDepends(depends);
      cc->SetCommandLines(mocCommandLines);
      mf.AddCustomCommandToOutput(std::move(cc));
    }
  }

  // Store the final list of source files and headers.
  mf.AddDefinition(sourceList, sourceListValue);
  mf.AddDefinition(headerList, headerListValue);
  return true;
}